

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_rc.cpp
# Opt level: O0

RK_S32 mpp_pid_calc(MppPIDCtx *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  RK_S32 b;
  RK_S32 a;
  MppPIDCtx *p_local;
  
  uVar2 = p->p * p->coef_p + p->i * p->coef_i + p->d * p->coef_d;
  iVar1 = p->div;
  if ((mpp_rc_debug & 0x20) != 0) {
    _mpp_log_l(4,"mpp_rc","RC: pid ctx %p p %10d coef %d\n",(char *)0x0,p,(ulong)(uint)p->p,
               p->coef_p);
  }
  if ((mpp_rc_debug & 0x20) != 0) {
    _mpp_log_l(4,"mpp_rc","RC: pid ctx %p i %10d coef %d\n",(char *)0x0,p,(ulong)(uint)p->i,
               p->coef_i);
  }
  if ((mpp_rc_debug & 0x20) != 0) {
    _mpp_log_l(4,"mpp_rc","RC: pid ctx %p d %10d coef %d\n",(char *)0x0,p,(ulong)(uint)p->d,
               p->coef_d);
  }
  if ((mpp_rc_debug & 0x20) != 0) {
    _mpp_log_l(4,"mpp_rc","RC: pid ctx %p a %10d b %d\n",(char *)0x0,p,(ulong)uVar2,iVar1);
  }
  iVar3 = 1;
  if ((int)uVar2 < 0) {
    iVar3 = -1;
  }
  return (int)(uVar2 + (iVar3 * iVar1) / 2) / iVar1;
}

Assistant:

RK_S32 mpp_pid_calc(MppPIDCtx *p)
{
    RK_S32 a = p->p * p->coef_p + p->i * p->coef_i + p->d * p->coef_d;
    RK_S32 b = p->div;

    mpp_rc_dbg_rc("RC: pid ctx %p p %10d coef %d\n", p, p->p, p->coef_p);
    mpp_rc_dbg_rc("RC: pid ctx %p i %10d coef %d\n", p, p->i, p->coef_i);
    mpp_rc_dbg_rc("RC: pid ctx %p d %10d coef %d\n", p, p->d, p->coef_d);
    mpp_rc_dbg_rc("RC: pid ctx %p a %10d b %d\n", p, a, b);

    return DIV(a, b);
}